

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O3

uint32_t __thiscall
ddd::DictionaryMLT<false,_false>::delete_key(DictionaryMLT<false,_false> *this,char *key)

{
  __uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  _Var1;
  pointer puVar2;
  uint32_t uVar3;
  bool bVar4;
  uint32_t uVar5;
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  *this_00;
  ulong uVar6;
  Query query;
  Query local_38;
  
  local_38.pos_ = 0;
  local_38.value_ = 0x7fffffff;
  local_38.node_pos_ = 0;
  local_38.is_finished_ = false;
  local_38.key_ = key;
  bVar4 = DaTrie<false,_false,_true>::search_prefix
                    ((this->prefix_subtrie_)._M_t.
                     super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl,
                     &local_38);
  uVar3 = local_38.node_pos_;
  uVar5 = 0xffffffff;
  if (bVar4) {
    if (local_38.is_finished_ == true) {
      DaTrie<false,_false,_true>::delete_prefix_leaf
                ((this->prefix_subtrie_)._M_t.
                 super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                 .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl,
                 &local_38);
    }
    else {
      uVar5 = local_38.value_;
      uVar6 = (ulong)local_38.value_;
      local_38.node_pos_ = 0;
      bVar4 = DaTrie<false,_false,_false>::delete_key
                        ((DaTrie<false,_false,_false> *)
                         (this->suffix_subtries_).
                         super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                         super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                         ._M_t,&local_38);
      if (!bVar4) {
        return 0xffffffff;
      }
      _Var1._M_t.
      super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
      .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl =
           (this->suffix_subtries_).
           super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
           super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
           ._M_t;
      if (*(long *)_Var1._M_t.
                   super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                   .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl ==
          *(long *)((long)_Var1._M_t.
                          super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                          .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                          _M_head_impl + 8)) {
        local_38.node_pos_ = uVar3;
        DaTrie<false,_false,_true>::delete_prefix_leaf
                  ((this->prefix_subtrie_)._M_t.
                   super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                   .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl,
                   &local_38);
        std::
        __uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
        ::reset((__uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                 *)((this->suffix_subtries_).
                    super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar6),(pointer)0x0);
        puVar2 = (this->suffix_subtries_).
                 super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((long)puVar2 -
            (long)(this->suffix_subtries_).
                  super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)(uVar5 + 1)) {
          this_00 = puVar2 + -1;
          (this->suffix_subtries_).
          super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = this_00;
          std::
          unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
          ::~unique_ptr(this_00);
        }
        else if (uVar5 < this->suffix_head_) {
          this->suffix_head_ = uVar5;
        }
      }
    }
    this->num_keys_ = this->num_keys_ - 1;
    uVar5 = local_38.value_;
  }
  return uVar5;
}

Assistant:

uint32_t delete_key(const char* key) {
    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      return NOT_FOUND;
    }

    if (query.is_finished()) {
      prefix_subtrie_->delete_prefix_leaf(query);
      --num_keys_;
      return query.value();
    }

    auto leaf_pos = query.node_pos();
    auto suffix_id = query.value();

    query.set_node_pos(ROOT_POS);
    if (!suffix_subtries_[suffix_id]->delete_key(query)) {
      return NOT_FOUND;
    }

    if (suffix_subtries_[suffix_id]->is_empty()) { // update suffix link
      query.set_node_pos(leaf_pos);
      prefix_subtrie_->delete_prefix_leaf(query);
      suffix_subtries_[suffix_id].reset();

      if (suffix_id + 1 == suffix_subtries_.size()) {
        suffix_subtries_.pop_back();
      } else if (suffix_id < suffix_head_) {
        suffix_head_ = suffix_id;
      }
    }

    --num_keys_;
    return query.value();
  }